

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

TestResult * test_one<unsigned_long>(random_numerators<unsigned_long> *vals,unsigned_long denom)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  divider<unsigned_long,_(libdivide::Branching)0> denom_00;
  divider<unsigned_long,_(libdivide::Branching)1> denom_01;
  divider<unsigned_long,_(libdivide::Branching)0> denom_02;
  divider<unsigned_long,_(libdivide::Branching)1> denom_03;
  undefined1 auVar3 [16];
  uint32_t uVar4;
  unsigned_long *puVar5;
  ulong in_RDX;
  ulong uVar6;
  random_numerators<unsigned_long> *in_RSI;
  TestResult *in_RDI;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar13 [16];
  undefined1 in_ZMM1 [64];
  timer t;
  uint64_t expected;
  size_t iter;
  time_double tresult;
  uint64_t min_gen_time;
  uint64_t min_his_time;
  uint64_t min_my_time_vector_branchfree;
  uint64_t min_my_time_vector;
  uint64_t min_my_time_branchfree;
  uint64_t min_my_time;
  divider<unsigned_long,_(libdivide::Branching)1> div_bfree;
  divider<unsigned_long,_(libdivide::Branching)0> div_bfull;
  bool testBranchfree;
  uint64_t twice_rem;
  uint64_t e;
  uint8_t more;
  uint64_t rem;
  uint64_t proposed_m;
  uint32_t floor_log_2_d;
  libdivide_u64_t result;
  uint64_t result_1;
  libdivide_u64_t tmp;
  libdivide_u64_branchfree_t ret;
  uint64_t twice_rem_1;
  uint64_t e_1;
  uint8_t more_1;
  uint64_t rem_1;
  uint64_t proposed_m_1;
  uint32_t floor_log_2_d_1;
  libdivide_u64_t result_2;
  uint64_t result_3;
  uint64_t in_stack_fffffffffffffc28;
  uint64_t in_stack_fffffffffffffc30;
  double local_3c8;
  pFuncToTime<unsigned_long,_libdivide::divider<unsigned_long,_(libdivide::Branching)1>_>
  in_stack_fffffffffffffc48;
  random_numerators<unsigned_long> *in_stack_fffffffffffffc50;
  unsigned_long in_stack_fffffffffffffc58;
  random_numerators<unsigned_long> *in_stack_fffffffffffffc60;
  undefined1 *in_stack_fffffffffffffc68;
  uint8_t uVar14;
  ulong local_388;
  uint64_t local_360;
  timer local_358;
  undefined8 local_331;
  undefined1 local_329;
  undefined8 local_321;
  undefined1 local_319;
  time_double local_318;
  long local_301;
  byte local_2f9;
  long local_2f1;
  byte local_2e9;
  time_double local_2e8;
  undefined8 local_2d1;
  undefined1 local_2c9;
  undefined8 local_2c1;
  undefined1 local_2b9;
  time_double local_2b8;
  long local_2a1;
  byte local_299;
  long local_291;
  byte local_289;
  time_double local_288;
  uint64_t local_278;
  time_double local_270;
  ulong local_260;
  uint64_t local_258;
  uint64_t local_250;
  unsigned_long local_248;
  unsigned_long local_240;
  unsigned_long local_238;
  unsigned_long local_230;
  unsigned_long local_228;
  unsigned_long local_220;
  undefined8 local_213;
  undefined1 local_20b;
  long local_20a;
  byte local_202;
  byte local_201;
  random_numerators<unsigned_long> *local_1f8;
  long *local_1e8;
  ulong local_1e0;
  undefined8 *local_1d8;
  long local_1d0;
  byte local_1c8;
  long *local_1b8;
  long local_1b0;
  byte local_1a8;
  long local_1a0;
  byte local_198;
  long local_188;
  byte local_180;
  long local_178;
  byte local_170;
  ulong local_168;
  ulong local_160;
  byte local_151;
  undefined1 local_150 [8];
  long local_148;
  int local_140;
  undefined4 local_13c;
  long local_129;
  byte local_121;
  long local_118;
  undefined1 *local_110;
  undefined8 local_100;
  ulong local_f8;
  long local_f0;
  byte local_e8;
  ulong local_e0;
  undefined8 *local_d8;
  long local_d0;
  byte local_c8;
  long local_c0;
  byte local_b8;
  long local_b0;
  byte local_a8;
  ulong local_a0;
  long local_91;
  byte local_89;
  long local_88;
  byte local_80;
  ulong local_78;
  long local_70;
  byte local_61;
  undefined1 local_60 [8];
  long local_58;
  int local_50;
  undefined4 local_4c;
  ulong local_48;
  long local_39;
  byte local_31;
  ulong local_30;
  undefined8 local_28;
  undefined1 *local_20;
  ulong local_18;
  undefined8 local_10;
  ulong local_8;
  
  local_201 = in_RDX != 1;
  local_1e8 = &local_20a;
  local_13c = 0;
  local_1b8 = local_1e8;
  if (in_RDX == 0) {
    fprintf(_stderr,"libdivide.h:%d: %s(): Error: %s\n",0x44c,"libdivide_internal_u64_gen",
            "divider must be != 0");
    abort();
  }
  local_140 = 0x3f - (int)LZCOUNT(in_RDX);
  local_121 = (byte)local_140;
  if ((in_RDX & in_RDX - 1) == 0) {
    local_129 = 0;
  }
  else {
    local_f8 = 1L << (local_121 & 0x3f);
    local_100 = 0;
    local_110 = local_150;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_f8;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = in_RDX;
    local_118 = 0;
    uVar6 = SUB168((auVar2 << 0x40) % auVar13,0);
    local_160 = in_RDX - uVar6;
    local_151 = local_121;
    local_148 = local_118;
    if ((ulong)(1L << (local_121 & 0x3f)) <= local_160) {
      local_148 = 0;
      local_168 = uVar6 * 2;
      if ((in_RDX <= local_168) || (local_168 < uVar6)) {
        local_148 = 1;
      }
      local_151 = local_121 | 0x40;
    }
    local_129 = local_148 + 1;
    local_121 = local_151;
  }
  local_170 = local_121;
  local_178 = local_129;
  local_198 = local_121;
  local_1a0 = local_129;
  local_180 = local_121;
  local_188 = local_129;
  local_1a8 = local_121;
  local_1b0 = local_129;
  local_1c8 = local_121;
  local_1d0 = local_129;
  local_20a = local_129;
  local_202 = local_121;
  local_388 = in_RDX;
  if (!(bool)local_201) {
    local_388 = 2;
  }
  local_1d8 = &local_213;
  local_1e0 = local_388;
  local_e0 = local_388;
  uVar14 = (uint8_t)local_1d8;
  local_a0 = local_388;
  local_d8 = local_1d8;
  if (local_388 == 1) {
    fprintf(_stderr,"libdivide.h:%d: %s(): Error: %s\n",0x484,"libdivide_u64_branchfree_gen",
            "branchfree divider must be != 1");
    abort();
  }
  local_48 = local_388;
  local_4c = 1;
  if (local_388 == 0) {
    fprintf(_stderr,"libdivide.h:%d: %s(): Error: %s\n",0x44c,"libdivide_internal_u64_gen",
            "divider must be != 0");
    abort();
  }
  local_30 = local_388;
  local_50 = 0x3f - (int)LZCOUNT(local_388);
  local_31 = (byte)local_50;
  if ((local_388 & local_388 - 1) == 0) {
    local_39 = 0;
    local_31 = local_31 - 1;
  }
  else {
    local_8 = 1L << (local_31 & 0x3f);
    local_10 = 0;
    local_18 = local_388;
    in_stack_fffffffffffffc68 = local_60;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_8;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_388;
    local_28 = 0;
    uVar6 = SUB168((auVar3 << 0x40) % auVar1,0);
    local_70 = local_388 - uVar6;
    local_58 = 0;
    local_78 = uVar6 * 2;
    if ((local_388 <= local_78) || (local_78 < uVar6)) {
      local_58 = 1;
    }
    local_61 = local_31 | 0x40;
    local_39 = local_58 + 1;
    local_31 = local_61;
    local_20 = in_stack_fffffffffffffc68;
  }
  local_80 = local_31;
  local_88 = local_39;
  local_b8 = local_31;
  local_c0 = local_39;
  local_a8 = local_31;
  local_b0 = local_39;
  local_91 = local_39;
  local_e8 = local_31 & 0x3f;
  local_d0 = local_39;
  local_f0 = local_39;
  local_220 = 0x7fffffffffffffff;
  local_228 = 0x7fffffffffffffff;
  local_230 = 0x7fffffffffffffff;
  local_238 = 0x7fffffffffffffff;
  local_240 = 0x7fffffffffffffff;
  local_248 = 0x7fffffffffffffff;
  local_1f8 = in_RSI;
  local_c8 = local_e8;
  local_89 = local_e8;
  for (local_260 = 0; auVar13 = in_ZMM1._0_16_, local_260 < 0x1e; local_260 = local_260 + 1) {
    local_270 = time_function<unsigned_long,unsigned_long>
                          (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                           (pFuncToTime<unsigned_long,_unsigned_long>)in_stack_fffffffffffffc50);
    local_258 = local_270.time;
    local_250 = local_270.result;
    puVar5 = std::min<unsigned_long>(&local_240,&local_258);
    local_240 = *puVar5;
    local_278 = local_250;
    local_291 = local_20a;
    local_289 = local_202;
    local_2a1 = local_20a;
    local_299 = local_202;
    denom_00.div.denom.more = uVar14;
    denom_00.div.denom.magic = (uint64_t)in_stack_fffffffffffffc68;
    local_288 = time_function<unsigned_long,libdivide::divider<unsigned_long,(libdivide::Branching)0>>
                          (in_stack_fffffffffffffc50,denom_00,
                           (pFuncToTime<unsigned_long,_libdivide::divider<unsigned_long>_>)
                           in_stack_fffffffffffffc48);
    local_258 = local_288.time;
    local_250 = local_288.result;
    puVar5 = std::min<unsigned_long>(&local_220,&local_258);
    local_220 = *puVar5;
    check_result(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,0);
    if ((local_201 & 1) != 0) {
      local_2c1 = local_213;
      local_2b9 = local_20b;
      local_2d1 = local_213;
      local_2c9 = local_20b;
      denom_01.div.denom.more = uVar14;
      denom_01.div.denom.magic = (uint64_t)in_stack_fffffffffffffc68;
      local_2b8 = time_function<unsigned_long,libdivide::divider<unsigned_long,(libdivide::Branching)1>>
                            (in_stack_fffffffffffffc50,denom_01,in_stack_fffffffffffffc48);
      local_258 = local_2b8.time;
      local_250 = local_2b8.result;
      puVar5 = std::min<unsigned_long>(&local_228,&local_258);
      local_228 = *puVar5;
      check_result(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,0);
    }
    local_2f1 = local_20a;
    local_2e9 = local_202;
    local_301 = local_20a;
    local_2f9 = local_202;
    denom_02.div.denom.more = uVar14;
    denom_02.div.denom.magic = (uint64_t)in_stack_fffffffffffffc68;
    local_2e8 = time_function<unsigned_long,libdivide::divider<unsigned_long,(libdivide::Branching)0>>
                          (in_stack_fffffffffffffc50,denom_02,
                           (pFuncToTime<unsigned_long,_libdivide::divider<unsigned_long>_>)
                           in_stack_fffffffffffffc48);
    local_258 = local_2e8.time;
    local_250 = local_2e8.result;
    puVar5 = std::min<unsigned_long>(&local_230,&local_258);
    local_230 = *puVar5;
    check_result(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,0);
    if ((local_201 & 1) != 0) {
      local_321 = local_213;
      local_319 = local_20b;
      local_331 = local_213;
      local_329 = local_20b;
      denom_03.div.denom.more = uVar14;
      denom_03.div.denom.magic = (uint64_t)in_stack_fffffffffffffc68;
      local_318 = time_function<unsigned_long,libdivide::divider<unsigned_long,(libdivide::Branching)1>>
                            (in_stack_fffffffffffffc50,denom_03,in_stack_fffffffffffffc48);
      local_258 = local_318.time;
      local_250 = local_318.result;
      puVar5 = std::min<unsigned_long>(&local_238,&local_258);
      local_238 = *puVar5;
      check_result(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,0);
    }
    timer::timer(&local_358);
    timer::start((timer *)0x10d731);
    generate_divisor<unsigned_long>(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    timer::stop((timer *)0x10d753);
    local_360 = timer::duration_nano(&local_358);
    puVar5 = std::min<unsigned_long>(&local_248,&local_360);
    local_248 = *puVar5;
  }
  auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,local_248);
  dVar7 = auVar2._0_8_;
  uVar4 = random_numerators<unsigned_long>::length(local_1f8);
  auVar13 = vcvtusi2sd_avx512f(auVar13,uVar4);
  auVar8._0_8_ = dVar7 / auVar13._0_8_;
  auVar8._8_8_ = 0;
  in_RDI->gen_time = auVar8._0_8_;
  auVar2 = vcvtusi2sd_avx512f(auVar8,local_220);
  dVar7 = auVar2._0_8_;
  uVar4 = random_numerators<unsigned_long>::length(local_1f8);
  auVar13 = vcvtusi2sd_avx512f(auVar13,uVar4);
  auVar9._0_8_ = dVar7 / auVar13._0_8_;
  auVar9._8_8_ = 0;
  in_RDI->base_time = auVar9._0_8_;
  if ((local_201 & 1) == 0) {
    dVar7 = -1.0;
  }
  else {
    auVar2 = vcvtusi2sd_avx512f(auVar9,local_228);
    dVar7 = auVar2._0_8_;
    uVar4 = random_numerators<unsigned_long>::length(local_1f8);
    auVar13 = vcvtusi2sd_avx512f(auVar13,uVar4);
    dVar7 = dVar7 / auVar13._0_8_;
  }
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar7;
  in_RDI->branchfree_time = dVar7;
  auVar2 = vcvtusi2sd_avx512f(auVar10,local_230);
  uVar4 = random_numerators<unsigned_long>::length(local_1f8);
  auVar13 = vcvtusi2sd_avx512f(auVar13,uVar4);
  auVar11._0_8_ = auVar2._0_8_ / auVar13._0_8_;
  auVar11._8_8_ = 0;
  in_RDI->vector_time = auVar11._0_8_;
  if ((local_201 & 1) == 0) {
    local_3c8 = -1.0;
  }
  else {
    auVar2 = vcvtusi2sd_avx512f(auVar11,local_238);
    local_3c8 = auVar2._0_8_;
    uVar4 = random_numerators<unsigned_long>::length(local_1f8);
    auVar13 = vcvtusi2sd_avx512f(auVar13,uVar4);
    local_3c8 = local_3c8 / auVar13._0_8_;
  }
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_3c8;
  in_RDI->vector_branchfree_time = local_3c8;
  auVar2 = vcvtusi2sd_avx512f(auVar12,local_240);
  dVar7 = auVar2._0_8_;
  uVar4 = random_numerators<unsigned_long>::length(local_1f8);
  auVar13 = vcvtusi2sd_avx512f(auVar13,uVar4);
  in_RDI->hardware_time = dVar7 / auVar13._0_8_;
  return in_RDI;
}

Assistant:

NOINLINE TestResult test_one(const random_numerators<IntT> &vals, IntT denom) {
    const bool testBranchfree = (denom != 1);
    divider<IntT, BRANCHFULL> div_bfull(denom);
    divider<IntT, BRANCHFREE> div_bfree(testBranchfree ? denom : 2);

    uint64_t min_my_time = INT64_MAX, min_my_time_branchfree = INT64_MAX,
             min_my_time_vector = INT64_MAX, min_my_time_vector_branchfree = INT64_MAX,
             min_his_time = INT64_MAX, min_gen_time = INT64_MAX;
    time_double tresult;
    for (size_t iter = 0; iter < TEST_COUNT; iter++) {
        tresult = time_function(vals, denom, sum_quotients);
        min_his_time = (std::min)(min_his_time, tresult.time);
        const uint64_t expected = tresult.result;

        tresult = time_function(vals, div_bfull, sum_quotients);
        min_my_time = (std::min)(min_my_time, tresult.time);
        check_result(tresult.result, expected, __LINE__);

        if (testBranchfree) {
            tresult = time_function(vals, div_bfree, sum_quotients);
            min_my_time_branchfree = (std::min)(min_my_time_branchfree, tresult.time);
            check_result(tresult.result, expected, __LINE__);
        }

#if defined(x86_VECTOR_TYPE) || defined(LIBDIVIDE_NEON)
        tresult = time_function(vals, div_bfull, sum_quotients_vec);
        min_my_time_vector = (std::min)(min_my_time_vector, tresult.time);
        check_result(tresult.result, expected, __LINE__);

        if (testBranchfree) {
            tresult = time_function(vals, div_bfree, sum_quotients_vec);
            min_my_time_vector_branchfree = (std::min)(min_my_time_vector_branchfree, tresult.time);
            check_result(tresult.result, expected, __LINE__);
        }
#else
        min_my_time_vector = 0;
        min_my_time_vector_branchfree = 0;
#endif

        {
            timer t;
            t.start();
            generate_divisor(vals, denom);
            t.stop();
            min_gen_time = (std::min)(min_gen_time, t.duration_nano());
        }
    }

    TestResult result;
    result.gen_time = min_gen_time / (double)vals.length();
    result.base_time = min_my_time / (double)vals.length();
    result.branchfree_time = testBranchfree ? min_my_time_branchfree / (double)vals.length() : -1;
    result.vector_time = min_my_time_vector / (double)vals.length();
    result.vector_branchfree_time =
        testBranchfree ? min_my_time_vector_branchfree / (double)vals.length() : -1;
    result.hardware_time = min_his_time / (double)vals.length();
    return result;
}